

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ConditionalPredicateSyntax * __thiscall
slang::parsing::Parser::parseConditionalPredicate
          (Parser *this,ExpressionSyntax *first,TokenKind endKind,Token *end)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  PatternSyntax *pattern;
  MatchesClauseSyntax *matchesClause;
  SourceLocation location;
  ConditionalPatternSyntax *pCVar4;
  undefined4 extraout_var;
  ConditionalPredicateSyntax *pCVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind TVar6;
  Token TVar7;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_f8;
  uint local_e4;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  local_e0._M_first._M_storage.info = (Info *)local_e0._M_rest;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  bVar2 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
  if (bVar2) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    pattern = parsePattern(this);
    matchesClause = slang::syntax::SyntaxFactory::matchesClause(&this->factory,TVar7,pattern);
  }
  else {
    matchesClause = (MatchesClauseSyntax *)0x0;
  }
  local_e0._M_rest =
       (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
       slang::syntax::SyntaxFactory::conditionalPattern(&this->factory,first,matchesClause);
  local_d0._0_1_ = 1;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
            (local_a8,(TokenOrSyntax *)&local_e0._M_first);
  bVar2 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
  if (bVar2) {
    local_e0._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_d0._0_1_ = 0;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_a8,(TokenOrSyntax *)&local_e0._M_first);
    local_f8 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(local_f8.kind);
    if (bVar2) {
      bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar2) {
        location = Token::location(&local_f8);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x340005,location);
      }
    }
    else {
      bVar2 = slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd(local_f8.kind);
      uVar1 = (uint)endKind;
      if (!bVar2) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_f8,endKind,end,(DiagCode)0x340005);
        src = extraout_RDX_03;
        goto LAB_003a7c3c;
      }
      do {
        local_e4 = uVar1;
        pCVar4 = parseConditionalPattern(this);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pCVar4;
        local_d0._0_1_ = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar7.kind;
        bVar2 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(TVar6);
        iVar3 = 3;
        src = extraout_RDX;
        if (TVar6 != EndOfFile && !bVar2) {
          if (TVar6 != TripleAnd) {
            if (endKind == Semicolon) goto LAB_003a7c19;
            ParserBase::expect(&this->super_ParserBase,TripleAnd);
            do {
              bVar2 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd,&slang::syntax::SyntaxFacts::isEndOfConditionalPredicate>
                                (&this->super_ParserBase,(DiagCode)0x340005,false);
              if (!bVar2) {
                TVar7 = ParserBase::expect(&this->super_ParserBase,(TokenKind)local_e4);
                src = TVar7.info;
                *end = TVar7;
                iVar3 = 1;
                goto LAB_003a7c19;
              }
              bVar2 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
            } while (!bVar2);
          }
          local_e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,TripleAnd);
          local_d0._0_1_ = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_e0._M_first);
          TVar7 = ParserBase::peek(&this->super_ParserBase);
          TVar6 = TVar7.kind;
          bVar2 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(TVar6);
          if (TVar6 == EndOfFile || bVar2) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if (((local_f8.kind != TVar6) || (local_f8.info != TVar7.info)) ||
               (bVar2 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd,&slang::syntax::SyntaxFacts::isEndOfConditionalPredicate>
                                  (&this->super_ParserBase,(DiagCode)0x340005,true),
               src = extraout_RDX_02, bVar2)) {
              iVar3 = 0;
              local_f8 = TVar7;
            }
          }
        }
LAB_003a7c19:
        uVar1 = local_e4;
      } while (iVar3 == 0);
      if (iVar3 != 3) goto LAB_003a7c3c;
    }
    TVar7 = ParserBase::expect(&this->super_ParserBase,endKind);
  }
  else {
    TVar7 = ParserBase::expect(&this->super_ParserBase,endKind);
  }
  src = TVar7.info;
  *end = TVar7;
LAB_003a7c3c:
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = CONCAT44(extraout_var,iVar3);
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d5a58;
  pCVar5 = slang::syntax::SyntaxFactory::conditionalPredicate
                     (&this->factory,
                      (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
                      &local_e0._M_first);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pCVar5;
}

Assistant:

ConditionalPredicateSyntax& Parser::parseConditionalPredicate(ExpressionSyntax& first,
                                                              TokenKind endKind, Token& end) {
    SmallVector<TokenOrSyntax, 4> buffer;

    MatchesClauseSyntax* matchesClause = nullptr;
    if (peek(TokenKind::MatchesKeyword)) {
        auto matches = consume();
        matchesClause = &factory.matchesClause(matches, parsePattern());
    }

    buffer.push_back(&factory.conditionalPattern(first, matchesClause));

    if (peek(TokenKind::TripleAnd)) {
        buffer.push_back(consume());
        parseList<isPossibleExpressionOrTripleAnd, isEndOfConditionalPredicate>(
            buffer, endKind, TokenKind::TripleAnd, end, RequireItems::True,
            diag::ExpectedConditionalPattern, [this] { return &parseConditionalPattern(); });
    }
    else {
        end = expect(endKind);
    }

    return factory.conditionalPredicate(buffer.copy(alloc));
}